

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::StyleColorsDark(ImGuiStyle *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiStyle *in_RDI;
  ImVec4 IVar4;
  ImVec4 *colors;
  ImGuiStyle *style;
  ImVec4 *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  float _w;
  ImGuiStyle *local_330;
  ImVec4 local_328;
  ImVec4 local_318;
  ImVec4 local_308;
  ImVec4 local_2f8;
  ImVec4 local_2e8;
  ImVec4 local_2d8;
  ImVec4 local_2c8;
  ImVec4 local_2b8;
  ImVec4 local_2a8;
  ImVec4 local_298;
  ImVec4 local_288;
  ImVec4 local_278;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  ImVec4 local_218;
  ImVec4 local_208;
  ImVec4 local_1f8;
  ImVec4 local_1e8;
  ImVec4 local_1d8;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a8;
  ImVec4 local_198;
  ImVec4 local_188;
  ImVec4 local_178;
  ImVec4 local_168;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_138;
  ImVec4 local_128;
  ImVec4 local_118;
  ImVec4 local_108;
  ImVec4 local_f8;
  ImVec4 local_e8;
  ImVec4 local_d8;
  ImVec4 local_c8;
  ImVec4 local_b8;
  ImVec4 local_a8;
  ImVec4 local_98;
  ImVec4 local_88;
  ImVec4 local_78;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec4 local_38;
  ImVec4 local_28;
  ImVec4 *local_18;
  ImGuiStyle *local_10;
  
  local_330 = in_RDI;
  if (in_RDI == (ImGuiStyle *)0x0) {
    local_330 = GetStyle();
  }
  local_10 = local_330;
  local_18 = local_330->Colors;
  ImVec4::ImVec4(&local_28,1.0,1.0,1.0,1.0);
  local_18->x = local_28.x;
  local_18->y = local_28.y;
  local_18->z = local_28.z;
  local_18->w = local_28.w;
  ImVec4::ImVec4(&local_38,0.5,0.5,0.5,1.0);
  local_18[1].x = local_38.x;
  local_18[1].y = local_38.y;
  local_18[1].z = local_38.z;
  local_18[1].w = local_38.w;
  _w = 0.94;
  ImVec4::ImVec4(&local_48,0.06,0.06,0.06,0.94);
  local_18[2].x = local_48.x;
  local_18[2].y = local_48.y;
  local_18[2].z = local_48.z;
  local_18[2].w = local_48.w;
  ImVec4::ImVec4(&local_58,0.0,0.0,0.0,0.0);
  local_18[3].x = local_58.x;
  local_18[3].y = local_58.y;
  local_18[3].z = local_58.z;
  local_18[3].w = local_58.w;
  ImVec4::ImVec4(&local_68,0.08,0.08,0.08,_w);
  local_18[4].x = local_68.x;
  local_18[4].y = local_68.y;
  local_18[4].z = local_68.z;
  local_18[4].w = local_68.w;
  ImVec4::ImVec4(&local_78,0.43,0.43,0.5,0.5);
  local_18[5].x = local_78.x;
  local_18[5].y = local_78.y;
  local_18[5].z = local_78.z;
  local_18[5].w = local_78.w;
  ImVec4::ImVec4(&local_88,0.0,0.0,0.0,0.0);
  local_18[6].x = local_88.x;
  local_18[6].y = local_88.y;
  local_18[6].z = local_88.z;
  local_18[6].w = local_88.w;
  ImVec4::ImVec4(&local_98,0.16,0.29,0.48,0.54);
  local_18[7].x = local_98.x;
  local_18[7].y = local_98.y;
  local_18[7].z = local_98.z;
  local_18[7].w = local_98.w;
  ImVec4::ImVec4(&local_a8,0.26,0.59,0.98,0.4);
  local_18[8].x = local_a8.x;
  local_18[8].y = local_a8.y;
  local_18[8].z = local_a8.z;
  local_18[8].w = local_a8.w;
  ImVec4::ImVec4(&local_b8,0.26,0.59,0.98,0.67);
  local_18[9].x = local_b8.x;
  local_18[9].y = local_b8.y;
  local_18[9].z = local_b8.z;
  local_18[9].w = local_b8.w;
  ImVec4::ImVec4(&local_c8,0.04,0.04,0.04,1.0);
  local_18[10].x = local_c8.x;
  local_18[10].y = local_c8.y;
  local_18[10].z = local_c8.z;
  local_18[10].w = local_c8.w;
  ImVec4::ImVec4(&local_d8,0.16,0.29,0.48,1.0);
  local_18[0xb].x = local_d8.x;
  local_18[0xb].y = local_d8.y;
  local_18[0xb].z = local_d8.z;
  local_18[0xb].w = local_d8.w;
  ImVec4::ImVec4(&local_e8,0.0,0.0,0.0,0.51);
  local_18[0xc].x = local_e8.x;
  local_18[0xc].y = local_e8.y;
  local_18[0xc].z = local_e8.z;
  local_18[0xc].w = local_e8.w;
  ImVec4::ImVec4(&local_f8,0.14,0.14,0.14,1.0);
  local_18[0xd].x = local_f8.x;
  local_18[0xd].y = local_f8.y;
  local_18[0xd].z = local_f8.z;
  local_18[0xd].w = local_f8.w;
  ImVec4::ImVec4(&local_108,0.02,0.02,0.02,0.53);
  local_18[0xe].x = local_108.x;
  local_18[0xe].y = local_108.y;
  local_18[0xe].z = local_108.z;
  local_18[0xe].w = local_108.w;
  ImVec4::ImVec4(&local_118,0.31,0.31,0.31,1.0);
  local_18[0xf].x = local_118.x;
  local_18[0xf].y = local_118.y;
  local_18[0xf].z = local_118.z;
  local_18[0xf].w = local_118.w;
  ImVec4::ImVec4(&local_128,0.41,0.41,0.41,1.0);
  local_18[0x10].x = local_128.x;
  local_18[0x10].y = local_128.y;
  local_18[0x10].z = local_128.z;
  local_18[0x10].w = local_128.w;
  ImVec4::ImVec4(&local_138,0.51,0.51,0.51,1.0);
  local_18[0x11].x = local_138.x;
  local_18[0x11].y = local_138.y;
  local_18[0x11].z = local_138.z;
  local_18[0x11].w = local_138.w;
  ImVec4::ImVec4(&local_148,0.26,0.59,0.98,1.0);
  local_18[0x12].x = local_148.x;
  local_18[0x12].y = local_148.y;
  local_18[0x12].z = local_148.z;
  local_18[0x12].w = local_148.w;
  ImVec4::ImVec4(&local_158,0.24,0.52,0.88,1.0);
  local_18[0x13].x = local_158.x;
  local_18[0x13].y = local_158.y;
  local_18[0x13].z = local_158.z;
  local_18[0x13].w = local_158.w;
  ImVec4::ImVec4(&local_168,0.26,0.59,0.98,1.0);
  local_18[0x14].x = local_168.x;
  local_18[0x14].y = local_168.y;
  local_18[0x14].z = local_168.z;
  local_18[0x14].w = local_168.w;
  ImVec4::ImVec4(&local_178,0.26,0.59,0.98,0.4);
  local_18[0x15].x = local_178.x;
  local_18[0x15].y = local_178.y;
  local_18[0x15].z = local_178.z;
  local_18[0x15].w = local_178.w;
  ImVec4::ImVec4(&local_188,0.26,0.59,0.98,1.0);
  local_18[0x16].x = local_188.x;
  local_18[0x16].y = local_188.y;
  local_18[0x16].z = local_188.z;
  local_18[0x16].w = local_188.w;
  ImVec4::ImVec4(&local_198,0.06,0.53,0.98,1.0);
  local_18[0x17].x = local_198.x;
  local_18[0x17].y = local_198.y;
  local_18[0x17].z = local_198.z;
  local_18[0x17].w = local_198.w;
  ImVec4::ImVec4(&local_1a8,0.26,0.59,0.98,0.31);
  local_18[0x18].x = local_1a8.x;
  local_18[0x18].y = local_1a8.y;
  local_18[0x18].z = local_1a8.z;
  local_18[0x18].w = local_1a8.w;
  ImVec4::ImVec4(&local_1b8,0.26,0.59,0.98,0.8);
  local_18[0x19].x = local_1b8.x;
  local_18[0x19].y = local_1b8.y;
  local_18[0x19].z = local_1b8.z;
  local_18[0x19].w = local_1b8.w;
  ImVec4::ImVec4(&local_1c8,0.26,0.59,0.98,1.0);
  local_18[0x1a].x = local_1c8.x;
  local_18[0x1a].y = local_1c8.y;
  local_18[0x1a].z = local_1c8.z;
  local_18[0x1a].w = local_1c8.w;
  fVar1 = local_18[5].y;
  fVar2 = local_18[5].z;
  fVar3 = local_18[5].w;
  local_18[0x1b].x = local_18[5].x;
  local_18[0x1b].y = fVar1;
  local_18[0x1b].z = fVar2;
  local_18[0x1b].w = fVar3;
  ImVec4::ImVec4(&local_1d8,0.1,0.4,0.75,0.78);
  local_18[0x1c].x = local_1d8.x;
  local_18[0x1c].y = local_1d8.y;
  local_18[0x1c].z = local_1d8.z;
  local_18[0x1c].w = local_1d8.w;
  ImVec4::ImVec4(&local_1e8,0.1,0.4,0.75,1.0);
  local_18[0x1d].x = local_1e8.x;
  local_18[0x1d].y = local_1e8.y;
  local_18[0x1d].z = local_1e8.z;
  local_18[0x1d].w = local_1e8.w;
  ImVec4::ImVec4(&local_1f8,0.26,0.59,0.98,0.25);
  local_18[0x1e].x = local_1f8.x;
  local_18[0x1e].y = local_1f8.y;
  local_18[0x1e].z = local_1f8.z;
  local_18[0x1e].w = local_1f8.w;
  ImVec4::ImVec4(&local_208,0.26,0.59,0.98,0.67);
  local_18[0x1f].x = local_208.x;
  local_18[0x1f].y = local_208.y;
  local_18[0x1f].z = local_208.z;
  local_18[0x1f].w = local_208.w;
  ImVec4::ImVec4(&local_218,0.26,0.59,0.98,0.95);
  local_18[0x20].x = local_218.x;
  local_18[0x20].y = local_218.y;
  local_18[0x20].z = local_218.z;
  local_18[0x20].w = local_218.w;
  IVar4 = ImLerp((ImVec4 *)CONCAT44(_w,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68,0.0);
  local_228 = IVar4._0_8_;
  uStack_220 = IVar4._8_8_;
  local_18[0x21].x = (float)(int)local_228;
  local_18[0x21].y = (float)(int)((ulong)local_228 >> 0x20);
  local_18[0x21].z = (float)(int)uStack_220;
  local_18[0x21].w = (float)(int)((ulong)uStack_220 >> 0x20);
  fVar1 = local_18[0x19].y;
  fVar2 = local_18[0x19].z;
  fVar3 = local_18[0x19].w;
  local_18[0x22].x = local_18[0x19].x;
  local_18[0x22].y = fVar1;
  local_18[0x22].z = fVar2;
  local_18[0x22].w = fVar3;
  IVar4 = ImLerp((ImVec4 *)CONCAT44(_w,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68,0.0);
  local_238 = IVar4._0_8_;
  uStack_230 = IVar4._8_8_;
  local_18[0x23].x = (float)(int)local_238;
  local_18[0x23].y = (float)(int)((ulong)local_238 >> 0x20);
  local_18[0x23].z = (float)(int)uStack_230;
  local_18[0x23].w = (float)(int)((ulong)uStack_230 >> 0x20);
  IVar4 = ImLerp((ImVec4 *)CONCAT44(_w,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68,0.0);
  local_248 = IVar4._0_8_;
  uStack_240 = IVar4._8_8_;
  local_18[0x24].x = (float)(int)local_248;
  local_18[0x24].y = (float)(int)((ulong)local_248 >> 0x20);
  local_18[0x24].z = (float)(int)uStack_240;
  local_18[0x24].w = (float)(int)((ulong)uStack_240 >> 0x20);
  IVar4 = ImLerp((ImVec4 *)CONCAT44(_w,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68,0.0);
  local_258 = IVar4._0_8_;
  uStack_250 = IVar4._8_8_;
  local_18[0x25].x = (float)(int)local_258;
  local_18[0x25].y = (float)(int)((ulong)local_258 >> 0x20);
  local_18[0x25].z = (float)(int)uStack_250;
  local_18[0x25].w = (float)(int)((ulong)uStack_250 >> 0x20);
  ImVec4::ImVec4(&local_278,1.0,1.0,1.0,0.7);
  IVar4 = ::operator*((ImVec4 *)CONCAT44(_w,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68);
  local_268 = IVar4._0_8_;
  local_260 = IVar4._8_8_;
  local_18[0x26].x = (float)(int)local_268;
  local_18[0x26].y = (float)(int)((ulong)local_268 >> 0x20);
  local_18[0x26].z = (float)(int)local_260;
  local_18[0x26].w = (float)(int)((ulong)local_260 >> 0x20);
  ImVec4::ImVec4(&local_288,0.2,0.2,0.2,1.0);
  local_18[0x27].x = local_288.x;
  local_18[0x27].y = local_288.y;
  local_18[0x27].z = local_288.z;
  local_18[0x27].w = local_288.w;
  ImVec4::ImVec4(&local_298,0.61,0.61,0.61,1.0);
  local_18[0x28].x = local_298.x;
  local_18[0x28].y = local_298.y;
  local_18[0x28].z = local_298.z;
  local_18[0x28].w = local_298.w;
  ImVec4::ImVec4(&local_2a8,1.0,0.43,0.35,1.0);
  local_18[0x29].x = local_2a8.x;
  local_18[0x29].y = local_2a8.y;
  local_18[0x29].z = local_2a8.z;
  local_18[0x29].w = local_2a8.w;
  ImVec4::ImVec4(&local_2b8,0.9,0.7,0.0,1.0);
  local_18[0x2a].x = local_2b8.x;
  local_18[0x2a].y = local_2b8.y;
  local_18[0x2a].z = local_2b8.z;
  local_18[0x2a].w = local_2b8.w;
  ImVec4::ImVec4(&local_2c8,1.0,0.6,0.0,1.0);
  local_18[0x2b].x = local_2c8.x;
  local_18[0x2b].y = local_2c8.y;
  local_18[0x2b].z = local_2c8.z;
  local_18[0x2b].w = local_2c8.w;
  ImVec4::ImVec4(&local_2d8,0.26,0.59,0.98,0.35);
  local_18[0x2c].x = local_2d8.x;
  local_18[0x2c].y = local_2d8.y;
  local_18[0x2c].z = local_2d8.z;
  local_18[0x2c].w = local_2d8.w;
  ImVec4::ImVec4(&local_2e8,1.0,1.0,0.0,0.9);
  local_18[0x2d].x = local_2e8.x;
  local_18[0x2d].y = local_2e8.y;
  local_18[0x2d].z = local_2e8.z;
  local_18[0x2d].w = local_2e8.w;
  ImVec4::ImVec4(&local_2f8,0.26,0.59,0.98,1.0);
  local_18[0x2e].x = local_2f8.x;
  local_18[0x2e].y = local_2f8.y;
  local_18[0x2e].z = local_2f8.z;
  local_18[0x2e].w = local_2f8.w;
  ImVec4::ImVec4(&local_308,1.0,1.0,1.0,0.7);
  local_18[0x2f].x = local_308.x;
  local_18[0x2f].y = local_308.y;
  local_18[0x2f].z = local_308.z;
  local_18[0x2f].w = local_308.w;
  ImVec4::ImVec4(&local_318,0.8,0.8,0.8,0.2);
  local_18[0x30].x = local_318.x;
  local_18[0x30].y = local_318.y;
  local_18[0x30].z = local_318.z;
  local_18[0x30].w = local_318.w;
  ImVec4::ImVec4(&local_328,0.8,0.8,0.8,0.35);
  local_18[0x31].x = local_328.x;
  local_18[0x31].y = local_328.y;
  local_18[0x31].z = local_328.z;
  local_18[0x31].w = local_328.w;
  return;
}

Assistant:

void ImGui::StyleColorsDark(ImGuiStyle* dst)
{
    ImGuiStyle* style = dst ? dst : &ImGui::GetStyle();
    ImVec4* colors = style->Colors;

    colors[ImGuiCol_Text]                   = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    colors[ImGuiCol_TextDisabled]           = ImVec4(0.50f, 0.50f, 0.50f, 1.00f);
    colors[ImGuiCol_WindowBg]               = ImVec4(0.06f, 0.06f, 0.06f, 0.94f);
    colors[ImGuiCol_ChildBg]                = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_PopupBg]                = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    colors[ImGuiCol_Border]                 = ImVec4(0.43f, 0.43f, 0.50f, 0.50f);
    colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    colors[ImGuiCol_FrameBg]                = ImVec4(0.16f, 0.29f, 0.48f, 0.54f);
    colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_FrameBgActive]          = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_TitleBg]                = ImVec4(0.04f, 0.04f, 0.04f, 1.00f);
    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.16f, 0.29f, 0.48f, 1.00f);
    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.00f, 0.00f, 0.00f, 0.51f);
    colors[ImGuiCol_MenuBarBg]              = ImVec4(0.14f, 0.14f, 0.14f, 1.00f);
    colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.02f, 0.02f, 0.02f, 0.53f);
    colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.31f, 0.31f, 0.31f, 1.00f);
    colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.41f, 0.41f, 0.41f, 1.00f);
    colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.51f, 0.51f, 0.51f, 1.00f);
    colors[ImGuiCol_CheckMark]              = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_SliderGrab]             = ImVec4(0.24f, 0.52f, 0.88f, 1.00f);
    colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_Button]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.40f);
    colors[ImGuiCol_ButtonHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_ButtonActive]           = ImVec4(0.06f, 0.53f, 0.98f, 1.00f);
    colors[ImGuiCol_Header]                 = ImVec4(0.26f, 0.59f, 0.98f, 0.31f);
    colors[ImGuiCol_HeaderHovered]          = ImVec4(0.26f, 0.59f, 0.98f, 0.80f);
    colors[ImGuiCol_HeaderActive]           = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_Separator]              = colors[ImGuiCol_Border];
    colors[ImGuiCol_SeparatorHovered]       = ImVec4(0.10f, 0.40f, 0.75f, 0.78f);
    colors[ImGuiCol_SeparatorActive]        = ImVec4(0.10f, 0.40f, 0.75f, 1.00f);
    colors[ImGuiCol_ResizeGrip]             = ImVec4(0.26f, 0.59f, 0.98f, 0.25f);
    colors[ImGuiCol_ResizeGripHovered]      = ImVec4(0.26f, 0.59f, 0.98f, 0.67f);
    colors[ImGuiCol_ResizeGripActive]       = ImVec4(0.26f, 0.59f, 0.98f, 0.95f);
    colors[ImGuiCol_Tab]                    = ImLerp(colors[ImGuiCol_Header],       colors[ImGuiCol_TitleBgActive], 0.80f);
    colors[ImGuiCol_TabHovered]             = colors[ImGuiCol_HeaderHovered];
    colors[ImGuiCol_TabActive]              = ImLerp(colors[ImGuiCol_HeaderActive], colors[ImGuiCol_TitleBgActive], 0.60f);
    colors[ImGuiCol_TabUnfocused]           = ImLerp(colors[ImGuiCol_Tab],          colors[ImGuiCol_TitleBg], 0.80f);
    colors[ImGuiCol_TabUnfocusedActive]     = ImLerp(colors[ImGuiCol_TabActive],    colors[ImGuiCol_TitleBg], 0.40f);
    colors[ImGuiCol_DockingPreview]         = colors[ImGuiCol_HeaderActive] * ImVec4(1.0f, 1.0f, 1.0f, 0.7f);
    colors[ImGuiCol_DockingEmptyBg]         = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
    colors[ImGuiCol_PlotLines]              = ImVec4(0.61f, 0.61f, 0.61f, 1.00f);
    colors[ImGuiCol_PlotLinesHovered]       = ImVec4(1.00f, 0.43f, 0.35f, 1.00f);
    colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
    colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.26f, 0.59f, 0.98f, 0.35f);
    colors[ImGuiCol_DragDropTarget]         = ImVec4(1.00f, 1.00f, 0.00f, 0.90f);
    colors[ImGuiCol_NavHighlight]           = ImVec4(0.26f, 0.59f, 0.98f, 1.00f);
    colors[ImGuiCol_NavWindowingHighlight]  = ImVec4(1.00f, 1.00f, 1.00f, 0.70f);
    colors[ImGuiCol_NavWindowingDimBg]      = ImVec4(0.80f, 0.80f, 0.80f, 0.20f);
    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.80f, 0.80f, 0.80f, 0.35f);
}